

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O0

bool __thiscall iutest::detail::SocketWriter::SendLn(SocketWriter *this,string *message)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *message_local;
  SocketWriter *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::operator+(&local_38,message,"\r\n");
  bVar1 = Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool SendLn(const ::std::string& message)
    {
#ifdef IUTEST_OS_WINDOWS
        return Send(message + "\r\n");
#else
        return Send(message + "\r\n");
        //return Send(message + "\n");
#endif
    }